

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O0

bool anon_unknown.dwarf_454b::CheckAddressPipes(uintptr_t addr,int pagesize)

{
  int *piVar1;
  undefined1 local_128 [8];
  char drainbuf [256];
  int rv;
  int pagesize_local;
  uintptr_t addr_local;
  
  tcmalloc::TrivialOnce::RunOnce<(anonymous_namespace)::CheckAddressPipes(unsigned_long,int)::__0>
            (&CheckAddressPipes::once);
  while( true ) {
    drainbuf._252_4_ = raw_write(CheckAddressPipes::fds[1],(void *)addr,1);
    if (drainbuf._252_4_ == 0) {
      syscall(1,2,"Check failed: rv != 0: raw_write(...) == 0\n",0x2b);
      abort();
    }
    if (0 < (int)drainbuf._252_4_) {
      return true;
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0xe) {
      return false;
    }
    piVar1 = __errno_location();
    if (*piVar1 != 0xb) break;
    do {
      do {
        drainbuf._252_4_ = raw_read(CheckAddressPipes::fds[0],local_128,0x100);
      } while (-1 < (int)drainbuf._252_4_);
      piVar1 = __errno_location();
    } while (*piVar1 == 4);
    piVar1 = __errno_location();
    if (*piVar1 != 0xb) {
      syscall(1,2,"Check failed: errno == EAGAIN: read errno must be EAGAIN\n",0x39);
      abort();
    }
  }
  syscall(1,2,"Check failed: errno == EAGAIN: write errno must be EAGAIN\n",0x3a);
  abort();
}

Assistant:

bool CheckAddress(uintptr_t addr, int pagesize) {
  static tcmalloc::TrivialOnce once;
  static int fds[2];

  once.RunOnce([] () {
    RAW_CHECK(pipe(fds) == 0, "pipe(fds)");

    auto add_flag = [] (int fd, int get, int set, int the_flag) {
      int flags = fcntl(fd, get, 0);
      RAW_CHECK(flags >= 0, "fcntl get");
      flags |= the_flag;
      RAW_CHECK(fcntl(fd, set, flags) == 0, "fcntl set");
    };

    for (int i = 0; i < 2; i++) {
      add_flag(fds[i], F_GETFD, F_SETFD, FD_CLOEXEC);
      add_flag(fds[i], F_GETFL, F_SETFL, O_NONBLOCK);
    }
  });

  do {
    int rv = raw_write(fds[1], reinterpret_cast<void*>(addr), 1);
    RAW_CHECK(rv != 0, "raw_write(...) == 0");
    if (rv > 0) {
      return true;
    }
    if (errno == EFAULT) {
      return false;
    }

    RAW_CHECK(errno == EAGAIN, "write errno must be EAGAIN");

    char drainbuf[256];
    do {
      rv = raw_read(fds[0], drainbuf, sizeof(drainbuf));
      if (rv < 0 && errno != EINTR) {
        RAW_CHECK(errno == EAGAIN, "read errno must be EAGAIN");
        break;
      }
      // read succeeded or we got EINTR
    } while (true);
  } while (true);

  return false;
}